

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_nanohttp(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  int n_URL;
  uint uVar10;
  int test_ret;
  char *in_RSI;
  int n_ctxt;
  bool bVar11;
  int test_ret_1;
  int test_ret_2;
  
  if (quiet == '\0') {
    puts("Testing nanohttp : 13 of 17 functions ...");
  }
  bVar11 = true;
  iVar3 = 0;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    in_RSI = (char *)0x0;
    lVar7 = xmlNanoHTTPOpen("http://localhost/");
    xmlNanoHTTPAuthHeader(lVar7);
    call_tests = call_tests + 1;
    if (lVar7 != 0) {
      xmlNanoHTTPClose(lVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlNanoHTTPAuthHeader");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlNanoHTTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar4 = xmlMemBlocks();
    in_RSI = (char *)(ulong)(uint)(iVar4 - iVar1);
    printf("Leak of %d blocks found in xmlNanoHTTPCleanup");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 - (uint)(iVar1 != iVar2);
  bVar11 = true;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    in_RSI = (char *)0x0;
    lVar7 = xmlNanoHTTPOpen("http://localhost/");
    xmlNanoHTTPContentLength(lVar7);
    call_tests = call_tests + 1;
    if (lVar7 != 0) {
      xmlNanoHTTPClose(lVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlNanoHTTPContentLength");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    in_RSI = (char *)0x0;
    lVar7 = xmlNanoHTTPOpen("http://localhost/");
    xmlNanoHTTPEncoding(lVar7);
    call_tests = call_tests + 1;
    if (lVar7 != 0) {
      xmlNanoHTTPClose(lVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlNanoHTTPEncoding");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar10 = 0; uVar10 != 6; uVar10 = uVar10 + 1) {
    for (iVar2 = 0; iVar2 != 6; iVar2 = iVar2 + 1) {
      bVar11 = true;
      while (iVar4 = (int)in_RSI, bVar11) {
        iVar5 = xmlMemBlocks();
        pcVar8 = gen_fileoutput(uVar10,iVar4);
        in_RSI = gen_fileoutput(iVar2,iVar4);
        xmlNanoHTTPFetch(pcVar8,in_RSI,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar5 == iVar4) break;
        iVar4 = xmlMemBlocks();
        bVar11 = false;
        printf("Leak of %d blocks found in xmlNanoHTTPFetch",(ulong)(uint)(iVar4 - iVar5));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        in_RSI = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlNanoHTTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar2 != iVar4) {
    iVar5 = xmlMemBlocks();
    in_RSI = (char *)(ulong)(uint)(iVar5 - iVar2);
    printf("Leak of %d blocks found in xmlNanoHTTPInit");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 - ((uint)(iVar2 != iVar4) + iVar1);
  bVar11 = true;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    in_RSI = (char *)0x0;
    lVar7 = xmlNanoHTTPOpen("http://localhost/");
    xmlNanoHTTPMimeType(lVar7);
    call_tests = call_tests + 1;
    if (lVar7 != 0) {
      xmlNanoHTTPClose(lVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlNanoHTTPMimeType");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    bVar11 = true;
    while (iVar4 = (int)in_RSI, bVar11) {
      iVar5 = xmlMemBlocks();
      pcVar8 = gen_filepath(iVar1,iVar4);
      in_RSI = (char *)0x0;
      uVar9 = xmlNanoHTTPOpen(pcVar8);
      xmlNanoHTTPClose(uVar9);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 == iVar4) break;
      iVar4 = xmlMemBlocks();
      bVar11 = false;
      printf("Leak of %d blocks found in xmlNanoHTTPOpen",(ulong)(uint)(iVar4 - iVar5));
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = (char *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    bVar11 = true;
LAB_00126a61:
    if (bVar11) {
      bVar11 = true;
      while (iVar4 = (int)in_RSI, bVar11) {
        iVar5 = xmlMemBlocks();
        pcVar8 = gen_filepath(iVar1,iVar4);
        bVar11 = false;
        in_RSI = (char *)0x0;
        uVar9 = xmlNanoHTTPOpenRedir(pcVar8,0,0);
        xmlNanoHTTPClose(uVar9);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar5 == iVar4) goto LAB_00126a61;
        iVar4 = xmlMemBlocks();
        bVar11 = false;
        printf("Leak of %d blocks found in xmlNanoHTTPOpenRedir",(ulong)(uint)(iVar4 - iVar5));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d");
        printf(" %d");
        in_RSI = (char *)0x0;
        printf(" %d");
        putchar(10);
      }
      bVar11 = false;
      goto LAB_00126a61;
    }
  }
  function_tests = function_tests + 1;
  pcVar8 = (char *)0x1;
  iVar1 = 0;
  while (pcVar8 != (char *)0x0) {
    for (uVar10 = 0; pcVar8 = (char *)0x0, uVar10 != 2; uVar10 = uVar10 + 1) {
      while (iVar4 = (int)pcVar8, iVar4 != 4) {
        iVar5 = xmlMemBlocks();
        iVar6 = 0;
        lVar7 = xmlNanoHTTPOpen("http://localhost/");
        iVar6 = gen_int(iVar4,iVar6);
        in_RSI = (char *)0x0;
        xmlNanoHTTPRead(lVar7,0,iVar6);
        call_tests = call_tests + 1;
        if (lVar7 != 0) {
          xmlNanoHTTPClose(lVar7);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNanoHTTPRead",(ulong)(uint)(iVar6 - iVar5));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pcVar8;
        }
        pcVar8 = (char *)(ulong)(iVar4 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar3 = iVar3 - (iVar2 + test_ret_2 + iVar1);
  bVar11 = true;
  while (bVar11) {
    iVar1 = xmlMemBlocks();
    in_RSI = (char *)0x0;
    lVar7 = xmlNanoHTTPOpen("http://localhost/");
    xmlNanoHTTPReturnCode(lVar7);
    call_tests = call_tests + 1;
    if (lVar7 != 0) {
      xmlNanoHTTPClose(lVar7);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlNanoHTTPReturnCode");
    in_RSI = (char *)0x0;
    printf(" %d");
    putchar(10);
    iVar3 = iVar3 + -1;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
    pcVar8 = (char *)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar4 = (int)pcVar8;
      if (iVar4 == 6) break;
      iVar5 = xmlMemBlocks();
      in_RSI = gen_fileoutput(iVar4,iVar2);
      xmlNanoHTTPSave(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar5 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPSave",(ulong)(uint)(iVar2 - iVar5));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
        in_RSI = pcVar8;
      }
      pcVar8 = (char *)(ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    pcVar8 = gen_filepath(iVar2,(int)in_RSI);
    xmlNanoHTTPScanProxy(pcVar8);
    call_tests = call_tests + 1;
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  uVar10 = iVar1 - iVar3;
  if (uVar10 != 0) {
    printf("Module nanohttp: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_nanohttp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanohttp : 13 of 17 functions ...\n");
    test_ret += test_xmlNanoHTTPAuthHeader();
    test_ret += test_xmlNanoHTTPCleanup();
    test_ret += test_xmlNanoHTTPContentLength();
    test_ret += test_xmlNanoHTTPEncoding();
    test_ret += test_xmlNanoHTTPFetch();
    test_ret += test_xmlNanoHTTPInit();
    test_ret += test_xmlNanoHTTPMimeType();
    test_ret += test_xmlNanoHTTPOpen();
    test_ret += test_xmlNanoHTTPOpenRedir();
    test_ret += test_xmlNanoHTTPRead();
    test_ret += test_xmlNanoHTTPRedir();
    test_ret += test_xmlNanoHTTPReturnCode();
    test_ret += test_xmlNanoHTTPSave();
    test_ret += test_xmlNanoHTTPScanProxy();

    if (test_ret != 0)
	printf("Module nanohttp: %d errors\n", test_ret);
    return(test_ret);
}